

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O0

int mk_http_keepalive_check(mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  mk_server *server_local;
  mk_http_request *sr_local;
  mk_http_session *cs_local;
  
  if (server->keep_alive == '\0') {
    cs_local._4_4_ = -1;
  }
  else {
    if (sr->protocol == 10) {
      cs->close_now = 1;
    }
    else if (sr->protocol == 0xb) {
      cs->close_now = 0;
    }
    if ((sr->connection).data != (char *)0x0) {
      if (((cs->parser).header_connection == 1) && (sr->protocol == 0xb)) {
        cs->close_now = 0;
      }
      else if ((cs->parser).header_connection == 2) {
        cs->close_now = 1;
      }
    }
    if (cs->counter_connections < server->max_keep_alive_request) {
      cs_local._4_4_ = 0;
    }
    else {
      cs->close_now = 1;
      cs_local._4_4_ = -1;
    }
  }
  return cs_local._4_4_;
}

Assistant:

int mk_http_keepalive_check(struct mk_http_session *cs,
                            struct mk_http_request *sr,
                            struct mk_server *server)
{
    if (server->keep_alive == MK_FALSE) {
        return -1;
    }

    /* Default Keepalive is off */
    if (sr->protocol == MK_HTTP_PROTOCOL_10) {
        cs->close_now = MK_TRUE;
    }
    else if (sr->protocol == MK_HTTP_PROTOCOL_11) {
        cs->close_now = MK_FALSE;
    }

    if (sr->connection.data) {
        if (cs->parser.header_connection == MK_HTTP_PARSER_CONN_KA &&
            sr->protocol == MK_HTTP_PROTOCOL_11) {
            cs->close_now  = MK_FALSE;
        }
        else if (cs->parser.header_connection == MK_HTTP_PARSER_CONN_CLOSE) {
            cs->close_now  = MK_TRUE;
        }
    }

    /* Client has reached keep-alive connections limit */
    if (cs->counter_connections >= server->max_keep_alive_request) {
        cs->close_now = MK_TRUE;
        return -1;
    }

    return 0;
}